

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestSubmitHandler::GetSubmitResultsPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_8d;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string buildname;
  cmCTestSubmitHandler *this_local;
  string *name;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  buildname.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"BuildName",&local_79);
  cmCTest::GetCTestConfiguration(&local_58,pcVar1,&local_78);
  cmCTest::SafeBuildIdField((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_8d = 0;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Site",&local_191);
  cmCTest::GetCTestConfiguration(&local_170,pcVar1,&local_190);
  std::operator+(&local_150,&local_170,"___");
  std::operator+(&local_130,&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_110,&local_130,"___");
  cmCTest::GetCurrentTag_abi_cxx11_(&local_1b8,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&local_f0,&local_110,&local_1b8);
  std::operator+(&local_d0,&local_f0,"-");
  cmCTest::GetTestModelString_abi_cxx11_(&local_1d8,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&local_b0,&local_d0,&local_1d8);
  std::operator+(__return_storage_ptr__,&local_b0,"___XML___");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  local_8d = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSubmitHandler::GetSubmitResultsPrefix()
{
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));
  std::string name = this->CTest->GetCTestConfiguration("Site") + "___" +
    buildname + "___" + this->CTest->GetCurrentTag() + "-" +
    this->CTest->GetTestModelString() + "___XML___";
  return name;
}